

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaDefragmentationContext_T::~VmaDefragmentationContext_T(VmaDefragmentationContext_T *this)

{
  uint uVar1;
  VmaBlockVector **ppVVar2;
  uint32_t i;
  ulong uVar3;
  
  if (this->m_PoolBlockVector == (VmaBlockVector *)0x0) {
    uVar1 = this->m_BlockVectorCount;
    ppVVar2 = this->m_pBlockVectors;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      if (ppVVar2[uVar3] != (VmaBlockVector *)0x0) {
        ppVVar2[uVar3]->m_IncrementalSort = true;
      }
    }
  }
  else {
    this->m_PoolBlockVector->m_IncrementalSort = true;
  }
  if ((this->m_AlgorithmState != (void *)0x0) &&
     ((this->m_Algorithm == 8 || (this->m_Algorithm == 2)))) {
    VmaFree((this->m_MoveAllocator).m_pCallbacks,this->m_AlgorithmState);
  }
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::~VmaVector
            (&this->m_Moves);
  return;
}

Assistant:

VmaDefragmentationContext_T::~VmaDefragmentationContext_T()
{
    if (m_PoolBlockVector != VMA_NULL)
    {
        m_PoolBlockVector->SetIncrementalSort(true);
    }
    else
    {
        for (uint32_t i = 0; i < m_BlockVectorCount; ++i)
        {
            VmaBlockVector* vector = m_pBlockVectors[i];
            if (vector != VMA_NULL)
                vector->SetIncrementalSort(true);
        }
    }

    if (m_AlgorithmState)
    {
        switch (m_Algorithm)
        {
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateBalanced*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
            vma_delete_array(m_MoveAllocator.m_pCallbacks, reinterpret_cast<StateExtensive*>(m_AlgorithmState), m_BlockVectorCount);
            break;
        default:
            VMA_ASSERT(0);
        }
    }
}